

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int CMinternal_listen(CManager_conflict cm,attr_list listen_info,int try_others)

{
  atom_t aVar1;
  long lVar2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  attr_list p_Var6;
  char *pcVar7;
  attr_list *pp_Var8;
  FILE *pFVar9;
  int iVar10;
  transport_entry p_Var11;
  transport_entry_conflict *pp_Var12;
  long lVar13;
  attr_list p_Var14;
  char *chosen_transport;
  char *iface;
  timespec ts;
  char *local_50;
  char *local_48;
  timespec local_40;
  
  iVar10 = 0;
  local_50 = (char *)0x0;
  local_48 = (char *)0x0;
  p_Var14 = (attr_list)0x0;
  if (listen_info != (attr_list)0x0) {
    p_Var14 = (attr_list)attr_copy_list(listen_info);
    p_Var14 = split_transport_attributes(p_Var14);
    get_string_attr(p_Var14,CM_TRANSPORT,&local_50);
    get_string_attr(p_Var14,CM_IP_INTERFACE,&local_48);
    if (local_50 != (char *)0x0) {
      iVar3 = CMtrace_val[2];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(cm,CMConnectionVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)cm->CMTrace_file;
          _Var4 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"CM - Listening only on transport \"%s\"\n",local_50);
      }
      fflush((FILE *)cm->CMTrace_file);
      iVar3 = load_transport(cm,local_50,1);
      if (iVar3 == 0) {
        iVar3 = CMtrace_val[2];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar3 = CMtrace_init(cm,CMConnectionVerbose);
        }
        if (iVar3 != 0) {
          if (CMtrace_PID != 0) {
            pFVar9 = (FILE *)cm->CMTrace_file;
            _Var4 = getpid();
            pVar5 = pthread_self();
            fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar5);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"Failed to load transport \"%s\".  Revert to default.\n",
                  local_50);
        }
        fflush((FILE *)cm->CMTrace_file);
        iVar3 = CMtrace_val[5];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar3 = CMtrace_init(cm,CMTransportVerbose);
        }
        if (iVar3 != 0) {
          if (CMtrace_PID != 0) {
            pFVar9 = (FILE *)cm->CMTrace_file;
            _Var4 = getpid();
            pVar5 = pthread_self();
            fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar5);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"Failed to load transport \"%s\".  Revert to default.\n",
                  local_50);
        }
        fflush((FILE *)cm->CMTrace_file);
        if (try_others == 0) {
          iVar10 = 0;
          goto LAB_001182ec;
        }
        local_50 = (char *)0x0;
      }
    }
  }
  pp_Var12 = cm->transports;
  if ((pp_Var12 != (transport_entry_conflict *)0x0) &&
     (p_Var11 = *pp_Var12, p_Var11 != (transport_entry)0x0)) {
    iVar10 = 0;
    do {
      if ((local_50 == (char *)0x0) || (iVar3 = strcmp(p_Var11->trans_name,local_50), iVar3 == 0)) {
        p_Var6 = (*p_Var11->listen)(cm,&CMstatic_trans_svcs,p_Var11,p_Var14);
        add_attr(p_Var6,CM_CMANAGER_ID,1,(long)cm->CManager_ID);
        aVar1 = CM_IP_INTERFACE;
        if (local_48 != (char *)0x0) {
          pcVar7 = strdup(local_48);
          add_string_attr(p_Var6,aVar1,pcVar7);
        }
        pp_Var8 = cm->contact_lists;
        if (pp_Var8 == (attr_list *)0x0) {
          pp_Var8 = (attr_list *)INT_CMmalloc(0x10);
          lVar13 = 0;
        }
        else {
          lVar2 = 0;
          do {
            lVar13 = lVar2;
            lVar2 = lVar13 + 1;
          } while (pp_Var8[lVar13] != (attr_list)0x0);
          pp_Var8 = (attr_list *)INT_CMrealloc(pp_Var8,lVar13 * 8 + 0x10U & 0x7fffffff8);
        }
        cm->contact_lists = pp_Var8;
        pp_Var8[lVar13] = p_Var6;
        cm->contact_lists[lVar13 + 1] = (attr_list)0x0;
        pFVar9 = (FILE *)cm->CMTrace_file;
        if (pFVar9 == (FILE *)0x0) {
          iVar3 = CMtrace_init(cm,CMConnectionVerbose);
          if (iVar3 != 0) {
            pFVar9 = (FILE *)cm->CMTrace_file;
            goto LAB_001182ae;
          }
        }
        else if (CMtrace_val[2] != 0) {
LAB_001182ae:
          fwrite("Adding contact list -> ",0x17,1,pFVar9);
          fdump_attr_list(cm->CMTrace_file,p_Var6);
        }
        iVar10 = (iVar10 + 1) - (uint)(p_Var6 == (attr_list)0x0);
      }
      p_Var11 = pp_Var12[1];
      pp_Var12 = pp_Var12 + 1;
    } while (p_Var11 != (transport_entry)0x0);
  }
LAB_001182ec:
  if (p_Var14 != (attr_list)0x0) {
    free_attr_list(p_Var14);
  }
  return iVar10;
}

Assistant:

extern int
CMinternal_listen(CManager cm, attr_list listen_info, int try_others)
{
    int success = 0;
    transport_entry *trans_list;
    char *chosen_transport = NULL;
    char *iface = NULL;

    if (listen_info) {
        listen_info = split_transport_attributes(attr_copy_list(listen_info));
	get_string_attr(listen_info, CM_TRANSPORT, &chosen_transport);
	get_string_attr(listen_info, CM_IP_INTERFACE, &iface);
    }
    if (chosen_transport != NULL) {
        CMtrace_out(cm, CMConnectionVerbose,
		    "CM - Listening only on transport \"%s\"\n",
		    chosen_transport);
	if (load_transport(cm, chosen_transport, 1) == 0) {
	    CMtrace_out(cm, CMConnectionVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
					chosen_transport);
	    CMtrace_out(cm, CMTransportVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
			chosen_transport);
	    if (!try_others) {
		if (listen_info) free_attr_list(listen_info);
		return success;
	    }
	    chosen_transport = NULL;
	}
    }
    trans_list = cm->transports;
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	attr_list attrs;
	if ((chosen_transport == NULL) || 
	    (strcmp((*trans_list)->trans_name, chosen_transport) == 0)) {
	    attrs = (*trans_list)->listen(cm, &CMstatic_trans_svcs,
					  *trans_list,
					  listen_info);
	    add_attr(attrs, CM_CMANAGER_ID, Attr_Int4, (intptr_t)cm->CManager_ID);
	    if (iface) {
		add_string_attr(attrs, CM_IP_INTERFACE, strdup(iface));
	    }
	    add_contact_list(cm, attrs);
	    if (CMtrace_on(cm, CMConnectionVerbose)) {
		fprintf(cm->CMTrace_file, "Adding contact list -> ");
		fdump_attr_list(cm->CMTrace_file, attrs);
	    }
	    if (attrs != NULL) {
		success++;
	    }
	}
	trans_list++;
    }
    if (listen_info) free_attr_list(listen_info);
    return success;
}